

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializeToArray(MessageLite *this,void *data,int size)

{
  bool bVar1;
  undefined4 in_EDX;
  int in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = SerializePartialToArray
                    ((MessageLite *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToArray(void* data, int size) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToArray(data, size);
}